

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::equals(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  char *str;
  
  if (val->typ == VM_OBJ) {
    iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       metaclass_reg_);
    if (iVar3 != 0) {
      piVar1 = (int *)(this->super_CVmObject).ext_;
      iVar3 = *piVar1;
      piVar2 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                                ptr_ + 8);
      uVar4 = 0;
      if (iVar3 == *piVar2) {
        iVar3 = bcmp(piVar1 + 3,piVar2 + 3,(long)iVar3 << 2);
        uVar4 = (uint)(iVar3 == 0);
      }
      return uVar4;
    }
  }
  str = vm_val_t::get_as_string(val);
  if (str != (char *)0x0) {
    iVar3 = equals_str(this,str);
    return iVar3;
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjStringBuffer::equals(VMG_ vm_obj_id_t self,
                               const vm_val_t *val, int /*depth*/) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;

        /* if the lengths aren't equal, they're not equal */
        if (len1 != len2)
            return FALSE;

        /* they're equal if the contents match exactly */
        return memcmp(buf1, buf2, len1*sizeof(*buf1)) == 0;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return equals_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}